

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  ImDrawListSharedData *this_00;
  int *piVar1;
  
  ImGuiIO::ImGuiIO(&this->IO);
  ImGuiStyle::ImGuiStyle(&this->Style);
  this_00 = &this->DrawListSharedData;
  ImDrawListSharedData::ImDrawListSharedData(this_00);
  (this->WheelingWindowRefMousePos).x = 0.0;
  (this->WheelingWindowRefMousePos).y = 0.0;
  (this->ActiveIdClickOffset).x = 0.0;
  (this->ActiveIdClickOffset).y = 0.0;
  (this->NavScoringRect).Min.x = 0.0;
  (this->NavScoringRect).Min.y = 0.0;
  (this->NavScoringRect).Max.x = 0.0;
  (this->NavScoringRect).Max.y = 0.0;
  (this->NavInitResultRectRel).Min.x = 0.0;
  (this->NavInitResultRectRel).Min.y = 0.0;
  (this->NavInitResultRectRel).Max.x = 0.0;
  (this->NavInitResultRectRel).Max.y = 0.0;
  (this->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultLocal).ID = 0;
  (this->NavMoveResultLocal).FocusScopeId = 0;
  (this->Windows).Size = 0;
  (this->Windows).Capacity = 0;
  (this->Windows).Data = (ImGuiWindow **)0x0;
  (this->WindowsFocusOrder).Size = 0;
  (this->WindowsFocusOrder).Capacity = 0;
  (this->WindowsFocusOrder).Data = (ImGuiWindow **)0x0;
  (this->WindowsTempSortBuffer).Size = 0;
  (this->WindowsTempSortBuffer).Capacity = 0;
  (this->WindowsTempSortBuffer).Data = (ImGuiWindow **)0x0;
  (this->CurrentWindowStack).Size = 0;
  (this->CurrentWindowStack).Capacity = 0;
  (this->CurrentWindowStack).Data = (ImGuiWindow **)0x0;
  (this->WindowsById).Data.Size = 0;
  (this->WindowsById).Data.Capacity = 0;
  (this->WindowsById).Data.Data = (ImGuiStoragePair *)0x0;
  memset(&this->NextWindowData,0,0x84);
  (this->ColorStack).Size = 0;
  (this->ColorStack).Capacity = 0;
  (this->ColorStack).Data = (ImGuiColorMod *)0x0;
  (this->StyleVarStack).Size = 0;
  (this->StyleVarStack).Capacity = 0;
  (this->StyleVarStack).Data = (ImGuiStyleMod *)0x0;
  (this->FontStack).Size = 0;
  (this->FontStack).Capacity = 0;
  (this->FontStack).Data = (ImFont **)0x0;
  (this->FocusScopeStack).Size = 0;
  (this->FocusScopeStack).Capacity = 0;
  (this->FocusScopeStack).Data = (uint *)0x0;
  (this->ItemFlagsStack).Size = 0;
  (this->ItemFlagsStack).Capacity = 0;
  (this->ItemFlagsStack).Data = (int *)0x0;
  (this->GroupStack).Size = 0;
  (this->GroupStack).Capacity = 0;
  (this->GroupStack).Data = (ImGuiGroupData *)0x0;
  (this->OpenPopupStack).Size = 0;
  (this->OpenPopupStack).Capacity = 0;
  (this->OpenPopupStack).Data = (ImGuiPopupData *)0x0;
  (this->BeginPopupStack).Size = 0;
  (this->BeginPopupStack).Capacity = 0;
  (this->BeginPopupStack).Data = (ImGuiPopupData *)0x0;
  (this->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (this->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (this->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (this->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (this->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (this->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (this->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (this->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultLocalVisibleSet).ID = 0;
  (this->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (this->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (this->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (this->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (this->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (this->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (this->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (this->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (this->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultOther).ID = 0;
  (this->NavMoveResultOther).FocusScopeId = 0;
  (this->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (this->NavMoveResultOther).DistBox = 3.4028235e+38;
  (this->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (this->NavMoveResultOther).RectRel.Min.x = 0.0;
  (this->NavMoveResultOther).RectRel.Min.y = 0.0;
  (this->NavMoveResultOther).RectRel.Max.x = 0.0;
  (this->NavMoveResultOther).RectRel.Max.y = 0.0;
  (this->DrawData).Valid = false;
  (this->DrawData).DisplaySize.x = 0.0;
  (this->DrawData).DisplaySize.y = 0.0;
  (this->DrawData).FramebufferScale.x = 0.0;
  (this->DrawData).FramebufferScale.y = 0.0;
  (this->DrawData).TotalVtxCount = 0;
  (this->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(this->DrawData).DisplayPos.y = 0;
  (this->DrawData).CmdLists = (ImDrawList **)0x0;
  (this->DrawData).CmdListsCount = 0;
  (this->DrawData).TotalIdxCount = 0;
  (this->DrawDataBuilder).Layers[0].Size = 0;
  (this->DrawDataBuilder).Layers[0].Capacity = 0;
  (this->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
  (this->DrawDataBuilder).Layers[1].Size = 0;
  (this->DrawDataBuilder).Layers[1].Capacity = 0;
  (this->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
  memset(&this->BackgroundDrawList,0,200);
  (this->BackgroundDrawList)._Data = this_00;
  memset(&this->ForegroundDrawList,0,200);
  (this->ForegroundDrawList)._Data = this_00;
  (this->DragDropPayload).DataType[0] = '\0';
  (this->DragDropPayload).DataType[1] = '\0';
  (this->DragDropPayload).DataType[2] = '\0';
  (this->DragDropPayload).DataType[3] = '\0';
  (this->DragDropPayload).DataType[4] = '\0';
  (this->DragDropPayload).DataType[5] = '\0';
  (this->DragDropPayload).DataType[6] = '\0';
  (this->DragDropPayload).DataType[7] = '\0';
  (this->DragDropPayload).DataType[8] = '\0';
  (this->DragDropPayload).DataType[9] = '\0';
  (this->DragDropPayload).DataType[10] = '\0';
  (this->DragDropPayload).DataType[0xb] = '\0';
  (this->DragDropPayload).DataType[0xc] = '\0';
  (this->DragDropPayload).DataType[0xd] = '\0';
  (this->DragDropPayload).DataType[0xe] = '\0';
  (this->DragDropPayload).DataType[0xf] = '\0';
  (this->DragDropPayload).DataType[0x10] = '\0';
  (this->DragDropPayload).DataType[0x11] = '\0';
  (this->DragDropPayload).DataType[0x12] = '\0';
  (this->DragDropPayload).DataType[0x13] = '\0';
  (this->DragDropPayload).DataType[0x14] = '\0';
  (this->DragDropPayload).DataType[0x15] = '\0';
  (this->DragDropPayload).DataType[0x16] = '\0';
  (this->DragDropPayload).DataType[0x17] = '\0';
  (this->DragDropPayload).DataType[0x18] = '\0';
  (this->DragDropPayload).DataType[0x19] = '\0';
  (this->DragDropPayload).DataType[0x1a] = '\0';
  (this->DragDropPayload).DataType[0x1b] = '\0';
  (this->DragDropPayload).DataType[0x1c] = '\0';
  (this->DragDropPayload).DataType[0x1d] = '\0';
  (this->DragDropPayload).DataType[0x1e] = '\0';
  (this->DragDropPayload).DataType[0x1f] = '\0';
  (this->DragDropPayload).DataType[0x20] = '\0';
  (this->DragDropPayload).Data = (void *)0x0;
  (this->DragDropPayload).DataSize = 0;
  (this->DragDropPayload).SourceId = 0;
  (this->DragDropPayload).SourceParentId = 0;
  (this->DragDropPayload).DataFrameCount = -1;
  (this->DragDropPayload).Preview = false;
  (this->DragDropPayload).Delivery = false;
  (this->DragDropTargetRect).Min.x = 0.0;
  (this->DragDropTargetRect).Min.y = 0.0;
  (this->DragDropTargetRect).Max.x = 0.0;
  (this->DragDropTargetRect).Max.y = 0.0;
  (this->DragDropPayloadBufHeap).Size = 0;
  (this->DragDropPayloadBufHeap).Capacity = 0;
  (this->DragDropPayloadBufHeap).Data = (uchar *)0x0;
  (this->Tables).Buf.Size = 0;
  (this->Tables).Buf.Capacity = 0;
  (this->Tables).Buf.Data = (ImGuiTable *)0x0;
  (this->Tables).Map.Data.Size = 0;
  (this->Tables).Map.Data.Capacity = 0;
  (this->Tables).Map.Data.Data = (ImGuiStoragePair *)0x0;
  (this->Tables).FreeIdx = 0;
  (this->TabBars).Buf.Size = 0;
  (this->TabBars).Buf.Capacity = 0;
  (this->TabBars).Buf.Data = (ImGuiTabBar *)0x0;
  (this->TabBars).Map.Data.Size = 0;
  (this->TabBars).Map.Data.Capacity = 0;
  (this->TabBars).Map.Data.Data = (ImGuiStoragePair *)0x0;
  (this->TabBars).FreeIdx = 0;
  (this->CurrentTableStack).Size = 0;
  (this->CurrentTableStack).Capacity = 0;
  (this->CurrentTableStack).Data = (ImGuiPtrOrIndex *)0x0;
  (this->TablesLastTimeActive).Size = 0;
  (this->TablesLastTimeActive).Capacity = 0;
  (this->TablesLastTimeActive).Data = (float *)0x0;
  (this->DrawChannelsTempMergeBuffer).Size = 0;
  (this->DrawChannelsTempMergeBuffer).Capacity = 0;
  (this->DrawChannelsTempMergeBuffer).Data = (ImDrawChannel *)0x0;
  memset(&this->CurrentTabBarStack,0,0xec0);
  ImFont::ImFont(&this->InputTextPasswordFont);
  (this->ColorPickerRef).x = 0.0;
  (this->ColorPickerRef).y = 0.0;
  (this->ColorPickerRef).z = 0.0;
  (this->ColorPickerRef).w = 0.0;
  (this->LogBuffer).Buf.Size = 0;
  (this->LogBuffer).Buf.Capacity = 0;
  (this->LogBuffer).Buf.Data = (char *)0x0;
  (this->ClipboardHandlerData).Size = 0;
  (this->ClipboardHandlerData).Capacity = 0;
  (this->ClipboardHandlerData).Data = (char *)0x0;
  (this->MenusIdSubmittedThisFrame).Size = 0;
  (this->MenusIdSubmittedThisFrame).Capacity = 0;
  (this->MenusIdSubmittedThisFrame).Data = (uint *)0x0;
  (this->PlatformImePos).x = 0.0;
  (this->PlatformImePos).y = 0.0;
  (this->PlatformImeLastPos).x = 0.0;
  (this->PlatformImeLastPos).y = 0.0;
  (this->SettingsIniData).Buf.Size = 0;
  (this->SettingsIniData).Buf.Capacity = 0;
  (this->SettingsIniData).Buf.Data = (char *)0x0;
  (this->SettingsHandlers).Size = 0;
  (this->SettingsHandlers).Capacity = 0;
  (this->SettingsHandlers).Data = (ImGuiSettingsHandler *)0x0;
  (this->SettingsWindows).Buf.Size = 0;
  (this->SettingsWindows).Buf.Capacity = 0;
  (this->SettingsWindows).Buf.Data = (char *)0x0;
  (this->SettingsTables).Buf.Size = 0;
  (this->SettingsTables).Buf.Capacity = 0;
  (this->SettingsTables).Buf.Data = (char *)0x0;
  (this->Hooks).Size = 0;
  (this->Hooks).Capacity = 0;
  (this->Hooks).Data = (ImGuiContextHook *)0x0;
  (this->DebugMetricsConfig).ShowWindowsRects = false;
  (this->DebugMetricsConfig).ShowWindowsBeginOrder = false;
  (this->DebugMetricsConfig).ShowTablesRects = false;
  (this->DebugMetricsConfig).ShowDrawCmdMesh = true;
  (this->DebugMetricsConfig).ShowDrawCmdBoundingBoxes = true;
  (this->DebugMetricsConfig).ShowWindowsRectsType = -1;
  (this->DebugMetricsConfig).ShowTablesRectsType = -1;
  this->Initialized = false;
  this->FontAtlasOwnedByContext = shared_font_atlas == (ImFontAtlas *)0x0;
  this->Font = (ImFont *)0x0;
  this->FontSize = 0.0;
  this->FontBaseSize = 0.0;
  if (shared_font_atlas == (ImFontAtlas *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    shared_font_atlas = (ImFontAtlas *)(*GImAllocatorAllocFunc)(0x478,GImAllocatorUserData);
    ImFontAtlas::ImFontAtlas(shared_font_atlas);
  }
  (this->IO).Fonts = shared_font_atlas;
  this->Time = 0.0;
  this->FrameCount = 0;
  this->FrameCountEnded = -1;
  this->FrameCountRendered = -1;
  this->WithinFrameScope = false;
  this->WithinFrameScopeWithImplicitWindow = false;
  this->WithinEndChild = false;
  this->GcCompactAll = false;
  this->TestEngineHookIdInfo = 0;
  this->TestEngine = (void *)0x0;
  this->WindowsActiveCount = 0;
  this->ActiveIdUsingNavDirMask = 0;
  this->ActiveIdUsingNavInputMask = 0;
  this->ActiveIdUsingKeyInputMask = 0;
  this->TestEngineHookItems = false;
  this->CurrentWindow = (ImGuiWindow *)0x0;
  this->HoveredWindow = (ImGuiWindow *)0x0;
  this->HoveredRootWindow = (ImGuiWindow *)0x0;
  this->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  this->MovingWindow = (ImGuiWindow *)0x0;
  this->WheelingWindow = (ImGuiWindow *)0x0;
  this->WheelingWindowTimer = 0.0;
  this->HoveredId = 0;
  this->HoveredIdPreviousFrame = 0;
  this->HoveredIdAllowOverlap = false;
  this->HoveredIdUsingMouseWheel = false;
  this->HoveredIdPreviousFrameUsingMouseWheel = false;
  this->HoveredIdDisabled = false;
  this->HoveredIdTimer = 0.0;
  this->HoveredIdNotActiveTimer = 0.0;
  this->ActiveId = 0;
  this->ActiveIdIsAlive = 0;
  *(undefined8 *)((long)&this->ActiveId + 3) = 0;
  *(undefined8 *)((long)&this->ActiveIdTimer + 3) = 0;
  (this->ActiveIdClickOffset).x = -1.0;
  (this->ActiveIdClickOffset).y = -1.0;
  this->ActiveIdWindow = (ImGuiWindow *)0x0;
  this->ActiveIdSource = ImGuiInputSource_None;
  this->ActiveIdMouseButton = 0;
  *(undefined8 *)((long)&this->ActiveIdMouseButton + 2) = 0;
  this->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
  this->LastActiveId = 0;
  this->LastActiveIdTimer = 0.0;
  this->NavWindow = (ImGuiWindow *)0x0;
  this->NavId = 0;
  this->NavFocusScopeId = 0;
  this->NavActivateId = 0;
  this->NavActivateDownId = 0;
  this->NavActivatePressedId = 0;
  this->NavInputId = 0;
  this->NavJustTabbedId = 0;
  this->NavJustMovedToId = 0;
  this->NavJustMovedToFocusScopeId = 0;
  this->NavJustMovedToKeyMods = 0;
  this->NavNextActivateId = 0;
  this->NavInputSource = ImGuiInputSource_None;
  (this->NavScoringRect).Min.x = 0.0;
  (this->NavScoringRect).Min.y = 0.0;
  (this->NavScoringRect).Max.x = 0.0;
  (this->NavScoringRect).Max.y = 0.0;
  this->NavScoringCount = 0;
  this->NavLayer = ImGuiNavLayer_Main;
  this->NavIdTabCounter = 0x7fffffff;
  this->NavIdIsAlive = false;
  this->NavMousePosDirty = false;
  this->NavDisableHighlight = true;
  this->NavInitResultId = 0;
  this->NavMoveRequest = false;
  this->NavDisableMouseHover = false;
  this->NavAnyRequest = false;
  this->NavInitRequest = false;
  this->NavInitRequestFromMove = false;
  this->NavMoveDirLast = -1;
  this->NavMoveClipDir = -1;
  this->NavMoveRequestFlags = 0;
  this->NavMoveRequestForward = ImGuiNavForward_None;
  this->NavMoveRequestKeyMods = 0;
  this->NavMoveDir = -1;
  this->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  this->NavWrapRequestFlags = 0;
  this->NavWindowingTarget = (ImGuiWindow *)0x0;
  this->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
  this->NavWindowingListWindow = (ImGuiWindow *)0x0;
  this->NavWindowingTimer = 0.0;
  this->NavWindowingHighlightAlpha = 0.0;
  this->NavWindowingToggleLayer = false;
  this->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  this->FocusRequestNextWindow = (ImGuiWindow *)0x0;
  this->FocusRequestCurrCounterRegular = 0x7fffffff;
  this->FocusRequestCurrCounterTabStop = 0x7fffffff;
  this->FocusRequestNextCounterRegular = 0x7fffffff;
  this->FocusRequestNextCounterTabStop = 0x7fffffff;
  this->FocusTabPressed = false;
  this->DimBgRatio = 0.0;
  (this->BackgroundDrawList)._OwnerName = "##Background";
  (this->ForegroundDrawList)._OwnerName = "##Foreground";
  this->DragDropSourceFlags = 0;
  *(undefined4 *)((long)&this->MouseCursor + 3) = 0;
  this->MouseCursor = 0;
  this->DragDropSourceFrameCount = -1;
  this->DragDropMouseButton = -1;
  this->DragDropTargetId = 0;
  this->DragDropAcceptFlags = 0;
  this->DragDropAcceptIdCurrRectSurface = 0.0;
  this->DragDropAcceptIdCurr = 0;
  this->DragDropAcceptIdPrev = 0;
  this->DragDropAcceptFrameCount = -1;
  this->DragDropHoldJustPressedId = 0;
  this->CurrentTabBar = (ImGuiTabBar *)0x0;
  (this->LastValidMousePos).x = 0.0;
  (this->LastValidMousePos).y = 0.0;
  this->TempInputId = 0;
  this->ColorEditOptions = 0xa900000;
  this->DragDropPayloadBufLocal[0] = '\0';
  this->DragDropPayloadBufLocal[1] = '\0';
  this->DragDropPayloadBufLocal[2] = '\0';
  this->DragDropPayloadBufLocal[3] = '\0';
  this->DragDropPayloadBufLocal[4] = '\0';
  this->DragDropPayloadBufLocal[5] = '\0';
  this->DragDropPayloadBufLocal[6] = '\0';
  this->DragDropPayloadBufLocal[7] = '\0';
  this->DragDropPayloadBufLocal[8] = '\0';
  this->DragDropPayloadBufLocal[9] = '\0';
  this->DragDropPayloadBufLocal[10] = '\0';
  this->DragDropPayloadBufLocal[0xb] = '\0';
  this->DragDropPayloadBufLocal[0xc] = '\0';
  this->DragDropPayloadBufLocal[0xd] = '\0';
  this->DragDropPayloadBufLocal[0xe] = '\0';
  this->DragDropPayloadBufLocal[0xf] = '\0';
  this->CurrentTable = (ImGuiTable *)0x0;
  this->ColorEditLastColor[2] = 3.4028235e+38;
  this->ColorEditLastHue = 0.0;
  this->ColorEditLastSat = 0.0;
  this->ColorEditLastColor[0] = 3.4028235e+38;
  this->ColorEditLastColor[1] = 3.4028235e+38;
  this->SliderCurrentAccum = 0.0;
  this->SliderCurrentAccumDirty = false;
  this->DragCurrentAccumDirty = false;
  this->DragCurrentAccum = 0.0;
  this->DragSpeedDefaultRatio = 0.01;
  this->ScrollbarClickDeltaToGrabCenter = 0.0;
  this->TooltipOverrideCount = 0;
  this->TooltipSlowDelay = 0.5;
  (this->PlatformImePos).x = 3.4028235e+38;
  (this->PlatformImePos).y = 3.4028235e+38;
  (this->PlatformImeLastPos).x = 3.4028235e+38;
  (this->PlatformImeLastPos).y = 3.4028235e+38;
  this->PlatformLocaleDecimalPoint = '.';
  this->SettingsLoaded = false;
  this->SettingsDirtyTimer = 0.0;
  this->LogEnabled = false;
  this->LogType = ImGuiLogType_None;
  this->LogFile = (ImFileHandle)0x0;
  this->LogLinePosY = 3.4028235e+38;
  this->LogLineFirstItem = false;
  this->LogDepthRef = 0;
  this->LogDepthToExpandDefault = 2;
  this->LogDepthToExpand = 2;
  this->DebugItemPickerActive = false;
  this->DebugItemPickerBreakId = 0;
  memset(this->FramerateSecPerFrame,0,0x1e8);
  this->WantTextInputNextFrame = -1;
  this->WantCaptureMouseNextFrame = -1;
  this->WantCaptureKeyboardNextFrame = -1;
  memset(this->TempBuffer,0,0xc01);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas) : BackgroundDrawList(&DrawListSharedData), ForegroundDrawList(&DrawListSharedData)
    {
        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        GcCompactAll = false;
        TestEngineHookItems = false;
        TestEngineHookIdInfo = 0;
        TestEngine = NULL;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        HoveredWindowUnderMovingWindow = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowTimer = 0.0f;

        HoveredId = HoveredIdPreviousFrame = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdUsingMouseWheel = HoveredIdPreviousFrameUsingMouseWheel = false;
        HoveredIdDisabled = false;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdNoClearOnFocusLoss = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdUsingMouseWheel = false;
        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingNavInputMask = 0x00;
        ActiveIdUsingKeyInputMask = 0x00;
        ActiveIdClickOffset = ImVec2(-1, -1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavInputId = 0;
        NavJustTabbedId = NavJustMovedToId = NavJustMovedToFocusScopeId = NavNextActivateId = 0;
        NavJustMovedToKeyMods = ImGuiKeyModFlags_None;
        NavInputSource = ImGuiInputSource_None;
        NavScoringRect = ImRect();
        NavScoringCount = 0;
        NavLayer = ImGuiNavLayer_Main;
        NavIdTabCounter = INT_MAX;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveRequest = false;
        NavMoveRequestFlags = ImGuiNavMoveFlags_None;
        NavMoveRequestForward = ImGuiNavForward_None;
        NavMoveRequestKeyMods = ImGuiKeyModFlags_None;
        NavMoveDir = NavMoveDirLast = NavMoveClipDir = ImGuiDir_None;
        NavWrapRequestWindow = NULL;
        NavWrapRequestFlags = ImGuiNavMoveFlags_None;

        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;

        FocusRequestCurrWindow = FocusRequestNextWindow = NULL;
        FocusRequestCurrCounterRegular = FocusRequestCurrCounterTabStop = INT_MAX;
        FocusRequestNextCounterRegular = FocusRequestNextCounterTabStop = INT_MAX;
        FocusTabPressed = false;

        DimBgRatio = 0.0f;
        BackgroundDrawList._OwnerName = "##Background"; // Give it a name for debugging
        ForegroundDrawList._OwnerName = "##Foreground"; // Give it a name for debugging
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        CurrentTable = NULL;
        CurrentTabBar = NULL;

        LastValidMousePos = ImVec2(0.0f, 0.0f);
        TempInputId = 0;
        ColorEditOptions = ImGuiColorEditFlags__OptionsDefault;
        ColorEditLastHue = ColorEditLastSat = 0.0f;
        ColorEditLastColor[0] = ColorEditLastColor[1] = ColorEditLastColor[2] = FLT_MAX;
        SliderCurrentAccum = 0.0f;
        SliderCurrentAccumDirty = false;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        TooltipOverrideCount = 0;
        TooltipSlowDelay = 0.50f;

        PlatformImePos = PlatformImeLastPos = ImVec2(FLT_MAX, FLT_MAX);
        PlatformLocaleDecimalPoint = '.';

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugItemPickerActive = false;
        DebugItemPickerBreakId = 0;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }